

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# config.cpp
# Opt level: O0

void __thiscall
CConfigManager::RegisterCallback(CConfigManager *this,SAVECALLBACKFUNC pfnFunc,void *pUserData)

{
  undefined8 in_RDX;
  undefined8 in_RSI;
  char *in_RDI;
  int in_stack_ffffffffffffffd8;
  int in_stack_ffffffffffffffdc;
  
  dbg_assert_imp(in_RDI,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd8,(char *)0x22a038);
  *(undefined8 *)(in_RDI + (long)*(int *)(in_RDI + 0x130) * 0x10 + 0x30) = in_RSI;
  *(undefined8 *)(in_RDI + (long)*(int *)(in_RDI + 0x130) * 0x10 + 0x38) = in_RDX;
  *(int *)(in_RDI + 0x130) = *(int *)(in_RDI + 0x130) + 1;
  return;
}

Assistant:

void CConfigManager::RegisterCallback(SAVECALLBACKFUNC pfnFunc, void *pUserData)
{
	dbg_assert(m_NumCallbacks < MAX_CALLBACKS, "too many config callbacks");
	m_aCallbacks[m_NumCallbacks].m_pfnFunc = pfnFunc;
	m_aCallbacks[m_NumCallbacks].m_pUserData = pUserData;
	m_NumCallbacks++;
}